

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool string_parse_kv_override
               (char *data,
               vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_> *overrides)

{
  char *__s1;
  pointer *pplVar1;
  iterator __position;
  int iVar2;
  char *pcVar3;
  common_log *log;
  size_t sVar4;
  llama_model_kv_override kvo;
  llama_model_kv_override local_130;
  
  pcVar3 = strchr(data,0x3d);
  if ((pcVar3 == (char *)0x0) || (sVar4 = (long)pcVar3 - (long)data, 0x7f < (long)sVar4)) {
    if (common_log_verbosity_thold < 0) {
      return false;
    }
    log = common_log_main();
    pcVar3 = "%s: malformed KV override \'%s\'\n";
    goto LAB_001f969d;
  }
  strncpy(local_130.key,data,sVar4);
  *(undefined1 *)((long)&local_130 + sVar4 + 4) = 0;
  __s1 = pcVar3 + 1;
  iVar2 = strncmp(__s1,"int:",4);
  if (iVar2 == 0) {
    local_130.tag = LLAMA_KV_OVERRIDE_TYPE_INT;
    local_130.field_2.val_i64 = atol(pcVar3 + 5);
  }
  else {
    iVar2 = strncmp(__s1,"float:",6);
    if (iVar2 == 0) {
      local_130.tag = LLAMA_KV_OVERRIDE_TYPE_FLOAT;
      local_130.field_2.val_f64 = atof(pcVar3 + 7);
    }
    else {
      iVar2 = strncmp(__s1,"bool:",5);
      if (iVar2 != 0) {
        iVar2 = strncmp(__s1,"str:",4);
        if (iVar2 == 0) {
          local_130.tag = LLAMA_KV_OVERRIDE_TYPE_STR;
          sVar4 = strlen(pcVar3 + 5);
          if (sVar4 < 0x80) {
            strncpy(local_130.field_2.val_str,pcVar3 + 5,0x7f);
            local_130.field_2.val_str[0x7f] = '\0';
            goto LAB_001f979b;
          }
          if (common_log_verbosity_thold < 0) {
            return false;
          }
          log = common_log_main();
          pcVar3 = "%s: malformed KV override \'%s\', value cannot exceed 127 chars\n";
        }
        else {
          if (common_log_verbosity_thold < 0) {
            return false;
          }
          log = common_log_main();
          pcVar3 = "%s: invalid type for KV override \'%s\'\n";
        }
LAB_001f969d:
        common_log_add(log,GGML_LOG_LEVEL_ERROR,pcVar3,"string_parse_kv_override",data);
        return false;
      }
      local_130.tag = LLAMA_KV_OVERRIDE_TYPE_BOOL;
      iVar2 = strcmp(pcVar3 + 6,"true");
      if (iVar2 == 0) {
        local_130.field_2.val_bool = (bool)1;
      }
      else {
        iVar2 = strcmp(pcVar3 + 6,"false");
        if (iVar2 != 0) {
          if (common_log_verbosity_thold < 0) {
            return false;
          }
          log = common_log_main();
          pcVar3 = "%s: invalid boolean value for KV override \'%s\'\n";
          goto LAB_001f969d;
        }
        local_130.field_2.val_i64 = local_130.field_2.val_i64 & 0xffffffffffffff00;
      }
    }
  }
LAB_001f979b:
  __position._M_current =
       (overrides->
       super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (overrides->
      super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
    _M_realloc_insert<llama_model_kv_override>(overrides,__position,&local_130);
  }
  else {
    memcpy(__position._M_current,&local_130,0x108);
    pplVar1 = &(overrides->
               super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *pplVar1 = *pplVar1 + 1;
  }
  return true;
}

Assistant:

bool string_parse_kv_override(const char * data, std::vector<llama_model_kv_override> & overrides) {
    const char * sep = strchr(data, '=');
    if (sep == nullptr || sep - data >= 128) {
        LOG_ERR("%s: malformed KV override '%s'\n", __func__, data);
        return false;
    }
    llama_model_kv_override kvo;
    std::strncpy(kvo.key, data, sep - data);
    kvo.key[sep - data] = 0;
    sep++;
    if (strncmp(sep, "int:", 4) == 0) {
        sep += 4;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_INT;
        kvo.val_i64 = std::atol(sep);
    } else if (strncmp(sep, "float:", 6) == 0) {
        sep += 6;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_FLOAT;
        kvo.val_f64 = std::atof(sep);
    } else if (strncmp(sep, "bool:", 5) == 0) {
        sep += 5;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_BOOL;
        if (std::strcmp(sep, "true") == 0) {
            kvo.val_bool = true;
        } else if (std::strcmp(sep, "false") == 0) {
            kvo.val_bool = false;
        } else {
            LOG_ERR("%s: invalid boolean value for KV override '%s'\n", __func__, data);
            return false;
        }
    } else if (strncmp(sep, "str:", 4) == 0) {
        sep += 4;
        kvo.tag = LLAMA_KV_OVERRIDE_TYPE_STR;
        if (strlen(sep) > 127) {
            LOG_ERR("%s: malformed KV override '%s', value cannot exceed 127 chars\n", __func__, data);
            return false;
        }
        strncpy(kvo.val_str, sep, 127);
        kvo.val_str[127] = '\0';
    } else {
        LOG_ERR("%s: invalid type for KV override '%s'\n", __func__, data);
        return false;
    }
    overrides.emplace_back(std::move(kvo));
    return true;
}